

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int skip_to_end_of_word_and_terminate(char **ppw,int eol)

{
  ushort **ppuVar1;
  int eol_local;
  char **ppw_local;
  
  while (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)(uint)(byte)**ppw] & 0x8000) != 0) {
    *ppw = *ppw + 1;
  }
  if (eol == 0) {
    if (**ppw != ' ') {
      return -1;
    }
  }
  else if ((**ppw != '\r') && (**ppw != '\n')) {
    return -1;
  }
  do {
    **ppw = '\0';
    *ppw = *ppw + 1;
    ppuVar1 = __ctype_b_loc();
  } while (((*ppuVar1)[(int)(uint)(byte)**ppw] & 0x2000) != 0);
  if ((eol == 0) && (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)(uint)(byte)**ppw] & 0x8000) == 0))
  {
    ppw_local._4_4_ = -1;
  }
  else {
    ppw_local._4_4_ = 1;
  }
  return ppw_local._4_4_;
}

Assistant:

static int
skip_to_end_of_word_and_terminate(char **ppw, int eol)
{
	/* Forward until a space is found - use isgraph here */
	/* See http://www.cplusplus.com/reference/cctype/ */
	while (isgraph((unsigned char)**ppw)) {
		(*ppw)++;
	}

	/* Check end of word */
	if (eol) {
		/* must be a end of line */
		if ((**ppw != '\r') && (**ppw != '\n')) {
			return -1;
		}
	} else {
		/* must be a end of a word, but not a line */
		if (**ppw != ' ') {
			return -1;
		}
	}

	/* Terminate and forward to the next word */
	do {
		**ppw = 0;
		(*ppw)++;
	} while (isspace((unsigned char)**ppw));

	/* Check after term */
	if (!eol) {
		/* if it's not the end of line, there must be a next word */
		if (!isgraph((unsigned char)**ppw)) {
			return -1;
		}
	}

	/* ok */
	return 1;
}